

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  reference ppSVar2;
  bool result_1;
  ScopePool **fileScope;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  List *__range1_1;
  bool result;
  ScopePool **funcScope;
  const_iterator __end1;
  const_iterator __begin1;
  List *__range1;
  string *filename_local;
  cmFileLockPool *this_local;
  
  __end1 = std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
           begin(&this->FunctionScopes);
  funcScope = (ScopePool **)
              std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
              ::end(&this->FunctionScopes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmFileLockPool::ScopePool_*const_*,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
                                *)&funcScope);
    if (!bVar1) {
      __end1_1 = std::
                 vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
                 begin(&this->FileScopes);
      fileScope = (ScopePool **)
                  std::
                  vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                  ::end(&this->FileScopes);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<cmFileLockPool::ScopePool_*const_*,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
                            *)&fileScope);
        if (!bVar1) {
          bVar1 = ScopePool::IsAlreadyLocked(&this->ProcessScope,filename);
          return bVar1;
        }
        ppSVar2 = __gnu_cxx::
                  __normal_iterator<cmFileLockPool::ScopePool_*const_*,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
                  ::operator*(&__end1_1);
        bVar1 = ScopePool::IsAlreadyLocked(*ppSVar2,filename);
        if (bVar1) break;
        __gnu_cxx::
        __normal_iterator<cmFileLockPool::ScopePool_*const_*,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
        ::operator++(&__end1_1);
      }
      return true;
    }
    ppSVar2 = __gnu_cxx::
              __normal_iterator<cmFileLockPool::ScopePool_*const_*,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
              ::operator*(&__end1);
    bVar1 = ScopePool::IsAlreadyLocked(*ppSVar2,filename);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFileLockPool::ScopePool_*const_*,_std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (auto const& funcScope : this->FunctionScopes) {
    const bool result = funcScope->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (auto const& fileScope : this->FileScopes) {
    const bool result = fileScope->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}